

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void inplace_flip_container(roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,uint16_t lb_end)

{
  ushort uVar1;
  bool bVar2;
  run_container_t *c;
  _Bool _Var3;
  uint8_t uVar4;
  uint uVar5;
  array_container_t *paVar6;
  uint16_t *puVar7;
  long lVar8;
  uint8_t uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  run_container_t *run;
  uint i;
  uint uVar13;
  uint8_t local_39;
  run_container_t *local_38;
  
  iVar10 = x1_arr->size;
  if (((long)iVar10 == 0) || (x1_arr->keys[(long)iVar10 + -1] == hb)) {
    i = iVar10 - 1;
  }
  else {
    uVar13 = iVar10 - 1;
    uVar12 = 0;
    uVar5 = uVar13;
    do {
      if ((int)uVar13 < (int)uVar12) {
        i = ~uVar12;
        break;
      }
      i = uVar12 + uVar13 >> 1;
      uVar1 = *(ushort *)((long)x1_arr->keys + (ulong)(uVar12 + uVar13 & 0xfffffffe));
      if (uVar1 < hb) {
        uVar12 = i + 1;
        bVar2 = true;
        i = uVar5;
      }
      else if (hb < uVar1) {
        uVar13 = i - 1;
        bVar2 = true;
        i = uVar5;
      }
      else {
        bVar2 = false;
      }
      uVar5 = i;
    } while (bVar2);
  }
  if (-1 < (int)i) {
    local_39 = x1_arr->typecodes[i & 0xffff];
    paVar6 = (array_container_t *)x1_arr->containers[i & 0xffff];
    if (local_39 == '\x04') {
      paVar6 = (array_container_t *)
               shared_container_extract_copy((shared_container_t *)paVar6,&local_39);
    }
    uVar5 = (uint)lb_start;
    iVar10 = lb_end + 1;
    local_38 = (run_container_t *)0x0;
    if (local_39 == '\x03') {
      iVar10 = run_container_negation_range_inplace
                         ((run_container_t *)paVar6,uVar5,iVar10,&local_38);
      uVar9 = (uint8_t)iVar10;
    }
    else {
      if (local_39 == '\x02') {
        _Var3 = array_container_negation_range_inplace(paVar6,uVar5,iVar10,&local_38);
      }
      else {
        _Var3 = bitset_container_negation_range_inplace
                          ((bitset_container_t *)paVar6,uVar5,iVar10,&local_38);
      }
      uVar9 = '\x02' - _Var3;
    }
    c = local_38;
    run = local_38;
    uVar4 = uVar9;
    if (uVar9 == '\x04') {
      uVar4 = *(uint8_t *)&local_38->runs;
      run = *(run_container_t **)local_38;
    }
    if (uVar4 == '\x03') {
      uVar5 = croaring_hardware_support();
      if ((uVar5 & 2) == 0) {
        uVar5 = croaring_hardware_support();
        if ((uVar5 & 1) == 0) {
          iVar10 = run->n_runs;
          lVar8 = (long)iVar10;
          if (0 < lVar8) {
            lVar11 = 0;
            do {
              iVar10 = iVar10 + (uint)run->runs[lVar11].length;
              lVar11 = lVar11 + 1;
            } while (lVar8 != lVar11);
          }
        }
        else {
          iVar10 = _avx2_run_container_cardinality(run);
        }
      }
      else {
        iVar10 = _avx512_run_container_cardinality(run);
      }
    }
    else {
      iVar10 = run->n_runs;
    }
    if (iVar10 == 0) {
      container_free(c,uVar9);
      ra_remove_at_index(x1_arr,i);
      return;
    }
    x1_arr->containers[i] = c;
    x1_arr->typecodes[i] = uVar9;
    return;
  }
  uVar5 = (uint)lb_start;
  iVar10 = lb_end - uVar5;
  if (iVar10 + 2U < 3) {
    paVar6 = array_container_create_range(uVar5,lb_end + 1);
    uVar9 = '\x02';
    goto LAB_00120f47;
  }
  paVar6 = (array_container_t *)(*global_memory_hook.malloc)(0x10);
  if (paVar6 == (array_container_t *)0x0) {
LAB_00120f28:
    paVar6 = (array_container_t *)0x0;
  }
  else {
    puVar7 = (uint16_t *)(*global_memory_hook.malloc)(4);
    paVar6->array = puVar7;
    if (puVar7 == (uint16_t *)0x0) {
      (*global_memory_hook.free)(paVar6);
      goto LAB_00120f28;
    }
    paVar6->cardinality = 0;
    paVar6->capacity = 1;
  }
  uVar9 = '\x03';
  if (paVar6 != (array_container_t *)0x0) {
    *(uint *)(paVar6->array + (long)paVar6->cardinality * 2) = iVar10 * 0x10000 | uVar5;
    paVar6->cardinality = paVar6->cardinality + 1;
  }
LAB_00120f47:
  ra_insert_new_key_value_at(x1_arr,~i,hb,paVar6,uVar9);
  return;
}

Assistant:

static void inplace_flip_container(roaring_array_t *x1_arr, uint16_t hb,
                                   uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, (uint16_t)i, &ctype_in);
        flipped_container = container_inot_range(
            container_to_flip, ctype_in, (uint32_t)lb_start,
            (uint32_t)(lb_end + 1), &ctype_out);
        // if a new container was created, the old one was already freed
        if (container_get_cardinality(flipped_container, ctype_out)) {
            ra_set_container_at_index(x1_arr, i, flipped_container, ctype_out);
        } else {
            container_free(flipped_container, ctype_out);
            ra_remove_at_index(x1_arr, i);
        }

    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(x1_arr, -i - 1, hb, flipped_container,
                                   ctype_out);
    }
}